

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O1

VectorSet * __thiscall
TreeIncPruneBGPlanner::CrossSumNode
          (VectorSet *__return_storage_ptr__,TreeIncPruneBGPlanner *this,Index a,Index depth,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol)

{
  size_type *psVar1;
  pointer puVar2;
  MultiAgentDecisionProcessDiscreteInterface *pMVar3;
  pointer pdVar4;
  size_type sVar5;
  bool bVar6;
  PlanningUnitDecPOMDPDiscrete *pPVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  VectorSet *A;
  double *pdVar8;
  pointer pvVar9;
  ulong uVar10;
  Index jo;
  VectorSet G1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> as;
  vector<unsigned_int,_std::allocator<unsigned_int>_> os;
  VectorSet local_b8;
  new_allocator<double> *local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  VectorSet local_58;
  
  puVar2 = (this->_m_cs_nodes_at_level).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)depth <
      (ulong)((long)(this->_m_cs_nodes_at_level).
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
    puVar2 = puVar2 + depth;
    *puVar2 = *puVar2 + 1;
    this->_m_nodes_visited = this->_m_nodes_visited + 1;
    psVar1 = &(__return_storage_ptr__->data_).size_;
    (__return_storage_ptr__->data_).size_ = 0;
    (__return_storage_ptr__->data_).data_ = (pointer)0x0;
    __return_storage_ptr__->size1_ = 0;
    __return_storage_ptr__->size2_ = 0;
    bVar6 = CheckCache_CrossSum(this,a,depth,jpol,__return_storage_ptr__);
    if (!bVar6) {
      pPVar7 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
      if (pPVar7 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar7 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                 _m_puShared.px;
      }
      pMVar3 = (pPVar7->super_PlanningUnitMADPDiscrete)._m_madp;
      __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            (**(code **)((long)*pMVar3 + 0xe8))(pMVar3,depth);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,__x);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_88,
                 ((long)(jpol->
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(jpol->
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
                 (allocator_type *)&local_b8);
      if ((long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        pvVar9 = (jpol->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = 0;
        do {
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] =
               *(uint *)(*(long *)&(pvVar9->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data +
                        (ulong)local_70.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar10] * 4);
          uVar10 = uVar10 + 1;
          pvVar9 = pvVar9 + 1;
        } while ((long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2 != (uVar10 & 0xffffffff));
      }
      A = GetGaoa(this,a,&local_70,&local_88);
      UnionNode(&local_58,this,a,depth + 1,jpol);
      AlphaVectorPlanning::CrossSum(&local_b8,(AlphaVectorPlanning *)this,A,&local_58);
      sVar5 = local_b8.data_.size_;
      __return_storage_ptr__->size1_ = local_b8.size1_;
      __return_storage_ptr__->size2_ = local_b8.size2_;
      local_90 = (new_allocator<double> *)&__return_storage_ptr__->data_;
      if (&local_b8 != __return_storage_ptr__) {
        if (*psVar1 != local_b8.data_.size_) {
          pdVar4 = (__return_storage_ptr__->data_).data_;
          if (local_b8.data_.size_ != 0) {
            pdVar8 = __gnu_cxx::new_allocator<double>::allocate
                               (local_90,local_b8.data_.size_,(void *)0x0);
            (__return_storage_ptr__->data_).data_ = pdVar8;
          }
          if (*psVar1 != 0) {
            operator_delete(pdVar4,*psVar1 << 3);
          }
          if (sVar5 == 0) {
            (__return_storage_ptr__->data_).data_ = (pointer)0x0;
          }
          *psVar1 = sVar5;
        }
        if (local_b8.data_.size_ != 0) {
          memmove((__return_storage_ptr__->data_).data_,local_b8.data_.data_,
                  local_b8.data_.size_ << 3);
        }
      }
      if (local_b8.data_.size_ != 0) {
        operator_delete(local_b8.data_.data_,local_b8.data_.size_ << 3);
      }
      if (local_58.data_.size_ != 0) {
        operator_delete(local_58.data_.data_,local_58.data_.size_ << 3);
      }
      if (this->_m_pruneAfterCrossSum == true) {
        AlphaVectorPlanning::Prune(&local_b8,(AlphaVectorPlanning *)this,__return_storage_ptr__);
        sVar5 = local_b8.data_.size_;
        __return_storage_ptr__->size1_ = local_b8.size1_;
        __return_storage_ptr__->size2_ = local_b8.size2_;
        if (&local_b8 != __return_storage_ptr__) {
          if (*psVar1 != local_b8.data_.size_) {
            pdVar4 = (__return_storage_ptr__->data_).data_;
            if (local_b8.data_.size_ != 0) {
              pdVar8 = __gnu_cxx::new_allocator<double>::allocate
                                 (local_90,local_b8.data_.size_,(void *)0x0);
              (__return_storage_ptr__->data_).data_ = pdVar8;
            }
            if (*psVar1 != 0) {
              operator_delete(pdVar4,*psVar1 << 3);
            }
            if (sVar5 == 0) {
              (__return_storage_ptr__->data_).data_ = (pointer)0x0;
            }
            *psVar1 = sVar5;
          }
          if (local_b8.data_.size_ != 0) {
            memmove((__return_storage_ptr__->data_).data_,local_b8.data_.data_,
                    local_b8.data_.size_ << 3);
          }
        }
        if (local_b8.data_.size_ != 0) {
          operator_delete(local_b8.data_.data_,local_b8.data_.size_ << 3);
        }
      }
      AddToCache_CrossSum(this,a,depth,jpol,__return_storage_ptr__);
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

VectorSet
TreeIncPruneBGPlanner::CrossSumNode(Index a,
                                    Index depth,
                                    const vector<vector<Index> > &jpol)
{
    _m_cs_nodes_at_level.at(depth)++;
    _m_nodes_visited++;

    VectorSet G;
    if(CheckCache_CrossSum(a,depth,jpol,G))
    {
        // G has now been filled by the cache
    }
    else
    {
        vector<Index> os=GetObservationsFromDepth(depth);

#if DEBUG_TreeIncPruneBGPlannerVerbose
        cout << "CrossSumNode: a=" << a << ",d=" << depth << "(obs="
             << SoftPrintVector(os) << "),jpol="
             << SoftPrintJpol(jpol) << endl;
#endif

        // figure out which a,o,aPrime we need to get
        
        vector<Index> as(jpol.size());
        for(Index k=0;k!=as.size();++k)
            as[k]=jpol[k][os[k]];
        VectorSet *Gaoa=GetGaoa(a,os,as);

        G=CrossSum(*Gaoa,
                   UnionNode(a,
                             depth+1, // we up the depth
                             jpol));
        if(_m_pruneAfterCrossSum)
            G=PruneAfterCrossSum(depth, G);
        AddToCache_CrossSum(a, depth, jpol, G);
    }

    return(G);
}